

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexmetadata.cpp
# Opt level: O2

void __thiscall
QHexMetadata::clearMetadata(QHexMetadata *this,qint64 line,ClearMetadataCallback *cb)

{
  byte bVar1;
  Entry *pEVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  Data<QHashPrivate::Node<long_long,_QList<QHexMetadataItem>_>_> *pDVar6;
  iterator pos;
  iterator iVar7;
  ulong uVar8;
  uint uVar9;
  iterator iVar10;
  qint64 local_38;
  
  local_38 = line;
  iVar10 = QHash<long_long,_QList<QHexMetadataItem>_>::find(&this->m_metadata,&local_38);
  pDVar6 = iVar10.i.d;
  if (pDVar6 != (Data<QHashPrivate::Node<long_long,_QList<QHexMetadataItem>_>_> *)0x0 ||
      iVar10.i.bucket != 0) {
    uVar8 = iVar10.i.bucket >> 7;
    uVar9 = (uint)iVar10.i.bucket & 0x7f;
    pEVar2 = pDVar6->spans[uVar8].entries;
    bVar1 = pDVar6->spans[uVar8].offsets[uVar9];
    lVar3 = *(long *)((long)&pEVar2[bVar1].storage + 0x18);
    pos = QList<QHexMetadataItem>::begin
                    ((QList<QHexMetadataItem> *)((long)&pEVar2[bVar1].storage + 8));
    while (iVar7 = QList<QHexMetadataItem>::end
                             ((QList<QHexMetadataItem> *)
                              ((long)&pDVar6->spans[uVar8].entries
                                      [pDVar6->spans[uVar8].offsets[uVar9]].storage + 8)),
          pos.i != iVar7.i) {
      bVar5 = std::function<bool_(QHexMetadataItem_&)>::operator()(cb,pos.i);
      if (bVar5) {
        pos = QList<QHexMetadataItem>::erase
                        ((QList<QHexMetadataItem> *)
                         ((long)&pDVar6->spans[uVar8].entries[pDVar6->spans[uVar8].offsets[uVar9]].
                                 storage + 8),pos.i);
      }
      else {
        pos.i = pos.i + 1;
      }
    }
    lVar4 = *(long *)((long)&pDVar6->spans[uVar8].entries[pDVar6->spans[uVar8].offsets[uVar9]].
                             storage + 0x18);
    if (lVar4 == 0) {
      removeMetadata(this,local_38);
    }
    else if (lVar3 != lVar4) {
      changed(this);
    }
  }
  return;
}

Assistant:

void QHexMetadata::clearMetadata(qint64 line, ClearMetadataCallback&& cb) {
    auto iit = m_metadata.find(line);
    if(iit == m_metadata.end())
        return;

    auto oldsize = iit->size();

    for(auto it = iit->begin(); it != iit->end();) {
        if(cb(*it))
            it = iit->erase(it);
        else
            it++;
    }

    if(iit->empty()) {
        this->removeMetadata(line);
        return;
    }

    if(oldsize != iit->size())
        Q_EMIT changed();
}